

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall kratos::IRVisitor::visit_generator_root_tp(IRVisitor *this,Generator *generator)

{
  pointer *pptVar1;
  future<void> *pfVar2;
  pointer ptVar3;
  pointer ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  uint32_t uVar6;
  int iVar7;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  ulong uVar8;
  priority_task *ppVar9;
  pointer ppVar10;
  runtime_error *this_01;
  future<void> *t_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__fn;
  ulong __n;
  undefined1 this_02 [8];
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  ulong uVar11;
  undefined1 local_1e8 [8];
  GeneratorGraph graph;
  thread_pool pool;
  undefined1 auStack_a8 [8];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  undefined1 local_88 [8];
  future<void> t;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> nodes;
  Generator *local_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)local_1e8,generator);
  GeneratorGraph::get_nodes
            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
             &t.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(GeneratorGraph *)local_1e8);
  uVar6 = get_num_cpus();
  cxxpool::thread_pool::thread_pool((thread_pool *)&graph.root_,(ulong)uVar6);
  auStack_a8 = (undefined1  [8])0x0;
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)auStack_a8,
             (long)nodes.
                   super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start -
             (long)t.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi >> 3);
  uVar5 = pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
  this_02 = auStack_a8;
  pfVar2 = tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)
       t.super___basic_future<void>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  while( true ) {
    auStack_a8 = this_02;
    tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = pfVar2;
    if (pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next ==
        (__pthread_internal_list *)
        nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      for (; pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
                  (__pthread_internal_list *)uVar5, this_02 != (undefined1  [8])pfVar2;
          this_02 = (undefined1  [8])((long)this_02 + 0x10)) {
        std::future<void>::get((future<void> *)this_02);
        uVar5 = pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
      }
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)auStack_a8);
      cxxpool::thread_pool::~thread_pool((thread_pool *)&graph.root_);
      if (t.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(t.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,
                        (long)nodes.
                              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)t.super___basic_future<void>._M_state.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
      }
      std::
      _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_1e8);
      return;
    }
    nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    *(undefined1 **)&local_40->_M_use_count = &DAT_100000001;
    local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002b4f28;
    __fn = local_40 + 1;
    std::
    __create_task_state<void(),std::_Bind<kratos::IRVisitor::visit_generator_root_tp(kratos::Generator*)::__0(kratos::Generator*)>,std::allocator<int>>
              ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_ir_cc:131:28)_(kratos::Generator_*)>
                *)__fn,(allocator<int> *)
                       &nodes.
                        super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_88);
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)&pool.field_0x80);
    this_00 = local_40;
    if (iVar7 != 0) break;
    if ((char)graph.root_ == '\x01') {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 "push called while pool is shutting down","");
      std::runtime_error::runtime_error
                (this_01,(string *)
                         &nodes.
                          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined ***)this_01 = &PTR__runtime_error_002b5058;
      __cxa_throw(this_01,&cxxpool::thread_pool_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
    nodes.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)__fn;
    __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
                         ((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                          &pool.tasks_.field_0x18);
    ppVar4 = pool.tasks_.c.
             super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar3 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((long)pool.tasks_.c.
                super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ._M_impl.super__Vector_impl_data._M_start -
          (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 0x7fffffffffffffc0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar11 = (long)pool.tasks_.c.
                     super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                     ._M_impl.super__Vector_impl_data._M_start -
               (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage >> 6;
      uVar8 = uVar11 + (uVar11 == 0);
      __n = uVar8 + uVar11;
      if (0x1fffffffffffffe < __n) {
        __n = 0x1ffffffffffffff;
      }
      if (CARRY8(uVar8,uVar11)) {
        __n = 0x1ffffffffffffff;
      }
      if (__n == 0) {
        ppVar9 = (priority_task *)0x0;
      }
      else {
        ppVar9 = __gnu_cxx::new_allocator<cxxpool::detail::priority_task>::allocate
                           ((new_allocator<cxxpool::detail::priority_task> *)
                            &pool.threads_.
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,__n,(void *)0x0);
      }
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)(ppVar9 + uVar11),
                 (priority_task *)
                 &nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(anon_class_16_1_80eb7a8b *)0x0,
                 (unsigned_long *)__args_1,in_R8);
      pptVar1 = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      ppVar10 = std::
                vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ::_S_do_relocate(ptVar3,ppVar4,ppVar9,pptVar1);
      ppVar10 = std::
                vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ::_S_do_relocate(ppVar4,ppVar4,ppVar10 + 1,pptVar1);
      if (ptVar3 != (pointer)0x0) {
        operator_delete(ptVar3,(long)pool.tasks_.c.
                                     super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3);
      }
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar9 + __n;
      pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)ppVar9;
    }
    else {
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)
                 pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (priority_task *)
                 &nodes.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(anon_class_16_1_80eb7a8b *)0x0,
                 (unsigned_long *)__args_1,in_R8);
      ppVar10 = pool.tasks_.c.
                super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    pool.tasks_.c.
    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar10;
    std::
    push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
              (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,ppVar10);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
    std::condition_variable::notify_one();
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)auStack_a8,
               (future<void> *)local_88);
    if (t.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 t.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    uVar5 = pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
    this_02 = auStack_a8;
    pfVar2 = tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)
         &(pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->__next;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

void IRVisitor::visit_generator_root_tp(kratos::Generator *generator) {
    GeneratorGraph graph(generator);
    auto nodes = graph.get_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    std::vector<std::future<void>> tasks;
    tasks.reserve(nodes.size());
    for (auto *mod : nodes) {
        auto t = pool.push([=](Generator *g) { g->accept_generator(this); }, mod);
        tasks.emplace_back(std::move(t));
    }
    for (auto &t : tasks) {
        t.get();
    }
}